

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cmLocalGenerator::GetMSVCDebugFormatName
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,cmLocalGenerator *this,string *config,cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  bool bVar1;
  string *psVar2;
  string local_108;
  string local_e8;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  cmValue local_80;
  cmValue msvcDebugInformationFormatValue;
  allocator<char> local_59;
  string local_58;
  cmValue local_38;
  cmValue msvcDebugInformationFormatDefault;
  cmGeneratorTarget *target_local;
  string *config_local;
  cmLocalGenerator *this_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *msvcDebugInformationFormat;
  
  msvcDebugInformationFormatDefault.Value._7_1_ = 0;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(__return_storage_ptr__);
  this_00 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_MSVC_DEBUG_INFORMATION_FORMAT_DEFAULT",&local_59);
  local_38 = cmMakefile::GetDefinition(this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  msvcDebugInformationFormatValue.Value = local_38.Value;
  bVar1 = cmNonempty(local_38);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"MSVC_DEBUG_INFORMATION_FORMAT",&local_a1);
    local_80 = cmGeneratorTarget::GetProperty(target,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    bVar1 = cmValue::operator_cast_to_bool(&local_80);
    if (!bVar1) {
      local_80.Value = local_38.Value;
    }
    psVar2 = cmValue::operator*[abi_cxx11_(&local_80);
    std::__cxx11::string::string((string *)&local_e8,(string *)psVar2);
    std::__cxx11::string::string((string *)&local_108);
    cmGeneratorExpression::Evaluate
              (&local_c8,&local_e8,this,config,target,(cmGeneratorExpressionDAGChecker *)0x0,
               (cmGeneratorTarget *)0x0,&local_108);
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)__return_storage_ptr__,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<std::string> cmLocalGenerator::GetMSVCDebugFormatName(
  std::string const& config, cmGeneratorTarget const* target)
{
  // MSVC debug information format selection is activated by the presence
  // of a default whether or not it is overridden by a property.
  cm::optional<std::string> msvcDebugInformationFormat;
  cmValue msvcDebugInformationFormatDefault = this->Makefile->GetDefinition(
    "CMAKE_MSVC_DEBUG_INFORMATION_FORMAT_DEFAULT");
  if (cmNonempty(msvcDebugInformationFormatDefault)) {
    cmValue msvcDebugInformationFormatValue =
      target->GetProperty("MSVC_DEBUG_INFORMATION_FORMAT");
    if (!msvcDebugInformationFormatValue) {
      msvcDebugInformationFormatValue = msvcDebugInformationFormatDefault;
    }
    msvcDebugInformationFormat = cmGeneratorExpression::Evaluate(
      *msvcDebugInformationFormatValue, this, config, target);
  }
  return msvcDebugInformationFormat;
}